

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

char * ObsToString(pyhanabi_observation_t *observation)

{
  char *pcVar1;
  long *in_RDI;
  string str;
  HanabiObservation *in_stack_00000218;
  string local_28 [40];
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x28c,"char *ObsToString(pyhanabi_observation_t *)");
  }
  if (*in_RDI != 0) {
    hanabi_learning_env::HanabiObservation::ToString_abi_cxx11_(in_stack_00000218);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar1 = strdup(pcVar1);
    std::__cxx11::string::~string(local_28);
    return pcVar1;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x28d,"char *ObsToString(pyhanabi_observation_t *)");
}

Assistant:

char* ObsToString(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  std::string str = reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
                        observation->observation)
                        ->ToString();
  return strdup(str.c_str());
}